

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdfastpfor.h
# Opt level: O2

void __thiscall FastPForLib::SIMDFastPFor<8U>::SIMDFastPFor(SIMDFastPFor<8U> *this,uint32_t ps)

{
  uint32_t uVar1;
  allocator_type local_12;
  allocator_type local_11;
  
  (this->super_IntegerCODEC)._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001beb70;
  this->PageSize = ps;
  uVar1 = 0x20 - LZCOUNT(ps);
  if (ps == 0) {
    uVar1 = 0;
  }
  this->bitsPageSize = uVar1;
  std::
  vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
  ::vector(&this->datatobepacked,0x21,&local_11);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->bytescontainer,(ulong)((this->PageSize * 3 >> 8) + this->PageSize),&local_12);
  return;
}

Assistant:

SIMDFastPFor(uint32_t ps = 65536)
      : PageSize(ps), bitsPageSize(gccbits(PageSize)), datatobepacked(33),
        bytescontainer(PageSize + 3 * PageSize / BlockSize) {
    assert(ps / BlockSize * BlockSize == ps);
    assert(gccbits(static_cast<uint32_t>(BlockSizeInUnitsOfPackSize * PACKSIZE - 1)) <= 8);
  }